

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O0

bool slang::ast::unpackConcatenation
               (StreamingConcatenationExpression *lhs,PackIterator *iter,PackIterator iterEnd,
               uint64_t *bitOffset,uint64_t *dynamicSize,EvalContext *context,
               SmallVectorBase<slang::ConstantValue> *dryRun)

{
  SourceRange range_00;
  ConstantRange range_01;
  DiagCode code;
  span<slang::ConstantValue,_18446744073709551615UL> elems;
  bool bVar1;
  uint64_t uVar2;
  ConstantRange *pCVar3;
  unsigned_long *puVar4;
  RandomizeDetails *in_RCX;
  AssertionInstanceDetails *in_RDX;
  StreamingConcatenationExpression *in_RSI;
  StreamingConcatenationExpression *in_RDI;
  TempVarSymbol *in_R8;
  Symbol *in_R9;
  optional<unsigned_long> oVar5;
  span<slang::ConstantValue,_18446744073709551615UL> sVar6;
  optional<slang::ConstantRange> oVar7;
  SmallVectorBase<slang::ConstantValue> *unaff_retaddr;
  Type *in_stack_00000008;
  ConstantValue newValue;
  ConstantValue oldValue;
  Type *elemType_1;
  LValue lvalue;
  FixedSizeUnpackedArrayType rvalueType;
  optional<unsigned_long> withSize;
  Type *elemType;
  optional<slang::ConstantRange> range;
  ConstantValue rvalue_1;
  ConstantRange with;
  Type *arrayType;
  uint64_t bit;
  const_iterator iterConcat;
  SmallVector<slang::ConstantValue_*,_5UL> packed;
  ConstantValue rvalue;
  uint64_t streamWidth;
  ConstantValue cv;
  SmallVector<slang::ConstantValue,_2UL> toBeOrdered;
  uint64_t dynamicSizeSave;
  StreamingConcatenationExpression *concat;
  Expression *operand;
  StreamExpression *stream;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
  *__range2;
  Type *in_stack_fffffffffffff928;
  uint in_stack_fffffffffffff930;
  int32_t in_stack_fffffffffffff934;
  Type *in_stack_fffffffffffff938;
  undefined7 in_stack_fffffffffffff940;
  undefined1 in_stack_fffffffffffff947;
  Type *in_stack_fffffffffffff948;
  Type *in_stack_fffffffffffff950;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff958;
  pointer in_stack_fffffffffffff960;
  undefined6 in_stack_fffffffffffff968;
  undefined1 in_stack_fffffffffffff96e;
  undefined1 in_stack_fffffffffffff96f;
  vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *in_stack_fffffffffffff970;
  undefined4 in_stack_fffffffffffff978;
  bitwidth_t in_stack_fffffffffffff97c;
  Type *in_stack_fffffffffffff980;
  undefined4 in_stack_fffffffffffff988;
  int32_t in_stack_fffffffffffff98c;
  undefined4 in_stack_fffffffffffff990;
  undefined1 in_stack_fffffffffffff994;
  compare_three_way_result_t<unsigned_long,_unsigned_long> in_stack_fffffffffffff995;
  compare_three_way_result_t<unsigned_long,_unsigned_long> in_stack_fffffffffffff996;
  undefined1 in_stack_fffffffffffff997;
  SmallVectorBase<slang::ConstantValue_*> *in_stack_fffffffffffff9d8;
  ConstantValue *in_stack_fffffffffffff9e0;
  Type *in_stack_fffffffffffffa18;
  undefined7 in_stack_fffffffffffffa20;
  undefined1 in_stack_fffffffffffffa27;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffa28;
  undefined1 in_stack_fffffffffffffa47;
  EvalContext *in_stack_fffffffffffffa48;
  ConstantRange in_stack_fffffffffffffa50;
  ConstantRange in_stack_fffffffffffffaa8;
  uint64_t in_stack_fffffffffffffab0;
  ConstantValue *in_stack_fffffffffffffab8;
  LValue *in_stack_fffffffffffffad8;
  ConstantValue *in_stack_fffffffffffffb28;
  LValue *in_stack_fffffffffffffb30;
  undefined1 in_stack_fffffffffffffba7;
  ConstantValue *in_stack_fffffffffffffba8;
  ConstantValue *in_stack_fffffffffffffbb0;
  ConstantRange in_stack_fffffffffffffbb8;
  uint64_t *in_stack_fffffffffffffc18;
  uint64_t *in_stack_fffffffffffffc20;
  PackIterator in_stack_fffffffffffffc28;
  PackIterator *in_stack_fffffffffffffc30;
  Type *in_stack_fffffffffffffc38;
  __unspec local_24a;
  type local_249;
  SourceLocation local_248;
  SourceLocation SStack_240;
  undefined4 local_238;
  __unspec local_232;
  type local_231;
  _Storage<unsigned_long,_true> local_230;
  undefined1 local_228;
  Type *local_220;
  _Storage<slang::ConstantRange,_true> local_218;
  undefined4 local_210;
  _Storage<slang::ConstantRange,_true> local_204;
  undefined4 local_1fc;
  ConstantRange local_1d0;
  Type *local_1c8;
  undefined8 local_1c0;
  ConstantValue *local_1b8;
  uint64_t local_148;
  allocator<slang::ConstantValue> local_139 [65];
  uint local_f8;
  Type local_e8;
  uint64_t local_80;
  StreamingConcatenationExpression *local_78;
  Expression *local_70;
  reference local_68;
  StreamExpression *local_60;
  __normal_iterator<const_slang::ast::StreamingConcatenationExpression::StreamExpression_*,_std::span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>_>
  local_58;
  span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
  local_50;
  bitmask<slang::ast::ASTFlags> context_00;
  byte local_1;
  
  local_50 = StreamingConcatenationExpression::streams(in_RDI);
  context_00.m_bits = (underlying_type)&local_50;
  local_58._M_current =
       (StreamExpression *)
       std::
       span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
       ::begin((span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                *)in_stack_fffffffffffff928);
  local_60 = (StreamExpression *)
             std::
             span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
             ::end((span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                    *)in_stack_fffffffffffff938);
  sVar6._M_extent._M_extent_value = in_stack_fffffffffffff958._M_extent_value;
  sVar6._M_ptr = in_stack_fffffffffffff960;
  do {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::StreamingConcatenationExpression::StreamExpression_*,_std::span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::StreamingConcatenationExpression::StreamExpression_*,_std::span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>_>
                        *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                       (__normal_iterator<const_slang::ast::StreamingConcatenationExpression::StreamExpression_*,_std::span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffff928);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_1 = 1;
LAB_00a1fa56:
      return (bool)(local_1 & 1);
    }
    local_68 = __gnu_cxx::
               __normal_iterator<const_slang::ast::StreamingConcatenationExpression::StreamExpression_*,_std::span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>_>
               ::operator*(&local_58);
    local_70 = not_null<const_slang::ast::Expression_*>::operator*
                         ((not_null<const_slang::ast::Expression_*> *)0xa1ecb8);
    if (local_70->kind == Streaming) {
      local_78 = Expression::as<slang::ast::StreamingConcatenationExpression>(local_70);
      if ((in_stack_00000008 == (Type *)0x0) &&
         (uVar2 = StreamingConcatenationExpression::getSliceSize(local_78), uVar2 != 0)) {
        local_80 = *(uint64_t *)&(in_R8->super_VariableSymbol).super_ValueSymbol.super_Symbol;
        in_stack_fffffffffffff928 = &local_e8;
        SmallVector<slang::ConstantValue,_2UL>::SmallVector
                  ((SmallVector<slang::ConstantValue,_2UL> *)0xa1ed83);
        in_stack_fffffffffffffa18 = in_stack_fffffffffffff928;
        in_stack_fffffffffffffa27 =
             unpackConcatenation(in_RSI,(PackIterator *)in_RDX,(PackIterator)in_RCX,
                                 (uint64_t *)in_R8,(uint64_t *)in_R9,
                                 (EvalContext *)context_00.m_bits,unaff_retaddr);
        if ((bool)in_stack_fffffffffffffa27) {
          SmallVectorBase<slang::ConstantValue>::begin
                    ((SmallVectorBase<slang::ConstantValue> *)&local_e8);
          SmallVectorBase<slang::ConstantValue>::end
                    ((SmallVectorBase<slang::ConstantValue> *)&local_e8);
          std::allocator<slang::ConstantValue>::allocator
                    ((allocator<slang::ConstantValue> *)0xa1ee54);
          std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>::
          vector<slang::ConstantValue*,void>
                    (in_stack_fffffffffffff970,
                     (ConstantValue *)
                     CONCAT17(in_stack_fffffffffffff96f,
                              CONCAT16(in_stack_fffffffffffff96e,in_stack_fffffffffffff968)),
                     sVar6._M_ptr,(allocator_type *)sVar6._M_extent._M_extent_value._M_extent_value)
          ;
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                     (Elements *)in_stack_fffffffffffff928);
          std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::~vector
                    ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                     CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940));
          std::allocator<slang::ConstantValue>::~allocator(local_139);
          local_148 = slang::ConstantValue::getBitstreamWidth
                                ((ConstantValue *)in_stack_fffffffffffff9d8);
          StreamingConcatenationExpression::getSliceSize(local_78);
          Bitstream::reOrder(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,
                             (uint64_t)in_stack_fffffffffffffaa8);
          SmallVector<slang::ConstantValue_*,_5UL>::SmallVector
                    ((SmallVector<slang::ConstantValue_*,_5UL> *)0xa1ef17);
          packBitstream(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
          in_stack_fffffffffffff9e0 =
               (ConstantValue *)
               std::cbegin<slang::SmallVector<slang::ConstantValue*,5ul>>
                         ((SmallVector<slang::ConstantValue_*,_5UL> *)0xa1ef3b);
          local_1c0 = 0;
          local_1b8 = in_stack_fffffffffffff9e0;
          in_stack_fffffffffffff9d8 =
               (SmallVectorBase<slang::ConstantValue_*> *)
               std::cend<slang::SmallVector<slang::ConstantValue*,5ul>>
                         ((SmallVector<slang::ConstantValue_*,_5UL> *)0xa1ef7e);
          in_stack_fffffffffffff928 = (Type *)0x0;
          bVar1 = unpackConcatenation(in_RSI,(PackIterator *)in_RDX,(PackIterator)in_RCX,
                                      (uint64_t *)in_R8,(uint64_t *)in_R9,
                                      (EvalContext *)context_00.m_bits,unaff_retaddr);
          if (!bVar1) {
            local_1 = 0;
          }
          local_f8 = (uint)!bVar1;
          SmallVector<slang::ConstantValue_*,_5UL>::~SmallVector
                    ((SmallVector<slang::ConstantValue_*,_5UL> *)0xa1f0af);
          slang::ConstantValue::~ConstantValue((ConstantValue *)0xa1f0bc);
          slang::ConstantValue::~ConstantValue((ConstantValue *)0xa1f0c9);
        }
        else {
          local_1 = 0;
          local_f8 = 1;
        }
        SmallVector<slang::ConstantValue,_2UL>::~SmallVector
                  ((SmallVector<slang::ConstantValue,_2UL> *)0xa1f0d6);
        if (local_f8 != 0) goto LAB_00a1fa56;
      }
      else {
        in_stack_fffffffffffff928 = in_stack_00000008;
        bVar1 = unpackConcatenation(in_RSI,(PackIterator *)in_RDX,(PackIterator)in_RCX,
                                    (uint64_t *)in_R8,(uint64_t *)in_R9,
                                    (EvalContext *)context_00.m_bits,unaff_retaddr);
        if (!bVar1) {
          local_1 = 0;
          goto LAB_00a1fa56;
        }
      }
    }
    else {
      local_1c8 = not_null<const_slang::ast::Type_*>::operator*
                            ((not_null<const_slang::ast::Type_*> *)0xa1f11d);
      ConstantRange::ConstantRange(&local_1d0);
      slang::ConstantValue::ConstantValue((ConstantValue *)0xa1f13f);
      if (local_68->withExpr == (Expression *)0x0) {
        unpackBitstream(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
                        in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,
                        in_stack_fffffffffffffc18);
        slang::ConstantValue::operator=
                  ((ConstantValue *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                   (ConstantValue *)in_stack_fffffffffffff928);
        slang::ConstantValue::~ConstantValue((ConstantValue *)0xa1f5ae);
LAB_00a1f5ae:
        if (in_stack_00000008 == (Type *)0x0) {
          Expression::evalLValue
                    ((Expression *)in_stack_fffffffffffff938,
                     (EvalContext *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930));
          in_stack_fffffffffffff96f = LValue::operator_cast_to_bool((LValue *)0xa1f60c);
          if ((bool)in_stack_fffffffffffff96f) {
            if (local_68->withExpr != (Expression *)0x0) {
              if (((local_1d0.left != local_1d0.right) &&
                  (in_stack_fffffffffffff96e = Type::isQueue((Type *)0xa1f681),
                  (bool)in_stack_fffffffffffff96e)) &&
                 (bVar1 = slang::ConstantValue::isQueue((ConstantValue *)0xa1f6a1), !bVar1)) {
                in_stack_fffffffffffff950 = local_1c8;
                sVar6 = slang::ConstantValue::elements((ConstantValue *)0xa1f6c3);
                elems._M_ptr._7_1_ = in_stack_fffffffffffffa27;
                elems._M_ptr._0_7_ = in_stack_fffffffffffffa20;
                elems._M_extent._M_extent_value = in_stack_fffffffffffffa28._M_extent_value;
                constContainer(in_stack_fffffffffffffa18,elems);
                slang::ConstantValue::operator=
                          ((ConstantValue *)
                           CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                           (ConstantValue *)in_stack_fffffffffffff928);
                slang::ConstantValue::~ConstantValue((ConstantValue *)0xa1f72f);
              }
              in_stack_fffffffffffff948 = Type::getArrayElementType(in_stack_fffffffffffff938);
              in_stack_fffffffffffff947 =
                   Type::hasFixedRange((Type *)CONCAT44(in_stack_fffffffffffff934,
                                                        in_stack_fffffffffffff930));
              if (!(bool)in_stack_fffffffffffff947) {
                LValue::load(in_stack_fffffffffffffad8);
                in_stack_fffffffffffff938 =
                     (Type *)slang::ConstantValue::size
                                       ((ConstantValue *)
                                        CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930
                                                ));
                if (in_stack_fffffffffffff938 <= (Type *)(ulong)(uint)local_1d0.right) {
                  ConstantRange::ConstantRange
                            ((ConstantRange *)&stack0xfffffffffffffaa8,0,local_1d0.right);
                  Type::getDefaultValue(in_stack_fffffffffffff938);
                  Bitstream::resizeToRange
                            (in_stack_fffffffffffffbb0,in_stack_fffffffffffffbb8,
                             in_stack_fffffffffffffba8,(bool)in_stack_fffffffffffffba7);
                  slang::ConstantValue::~ConstantValue((ConstantValue *)0xa1f820);
                  LValue::store(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
                  slang::ConstantValue::~ConstantValue((ConstantValue *)0xa1f844);
                }
                slang::ConstantValue::~ConstantValue((ConstantValue *)0xa1f8af);
              }
              if (local_1d0.left == local_1d0.right) {
                in_stack_fffffffffffff934 = local_1d0.left;
                Type::getDefaultValue(in_stack_fffffffffffff938);
                LValue::addIndex((LValue *)
                                 CONCAT17(in_stack_fffffffffffff997,
                                          CONCAT16(in_stack_fffffffffffff996._M_value,
                                                   CONCAT15(in_stack_fffffffffffff995._M_value,
                                                            CONCAT14(in_stack_fffffffffffff994,
                                                                     in_stack_fffffffffffff990)))),
                                 in_stack_fffffffffffff98c,
                                 (ConstantValue *)in_stack_fffffffffffff980);
                slang::ConstantValue::~ConstantValue((ConstantValue *)0xa1f91d);
              }
              else {
                in_stack_fffffffffffffa50 = local_1d0;
                Type::getDefaultValue(in_stack_fffffffffffff938);
                range_01.right._0_1_ = in_stack_fffffffffffff994;
                range_01.left = in_stack_fffffffffffff990;
                range_01.right._1_1_ = in_stack_fffffffffffff995._M_value;
                range_01.right._2_1_ = in_stack_fffffffffffff996._M_value;
                range_01.right._3_1_ = in_stack_fffffffffffff997;
                LValue::addArraySlice
                          ((LValue *)CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
                           range_01,(ConstantValue *)in_stack_fffffffffffff980);
                slang::ConstantValue::~ConstantValue((ConstantValue *)0xa1f99b);
              }
            }
            LValue::store(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
            local_f8 = 0;
          }
          else {
            local_1 = 0;
            local_f8 = 1;
          }
          LValue::~LValue((LValue *)0xa1f9f1);
        }
        else {
          SmallVectorBase<slang::ConstantValue>::emplace_back<slang::ConstantValue>
                    ((SmallVectorBase<slang::ConstantValue> *)in_stack_fffffffffffff938,
                     (ConstantValue *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930))
          ;
          local_f8 = 3;
        }
      }
      else {
        oVar7 = Expression::evalSelector
                          ((Expression *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,
                           (bool)in_stack_fffffffffffffa47);
        local_218 = oVar7.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                    super__Optional_payload_base<slang::ConstantRange>._M_payload;
        local_210 = CONCAT31(local_210._1_3_,
                             oVar7.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload
                             .super__Optional_payload_base<slang::ConstantRange>._M_engaged);
        local_1fc = local_210;
        local_204 = local_218;
        bVar1 = std::optional::operator_cast_to_bool((optional<slang::ConstantRange> *)0xa1f1c7);
        if (bVar1) {
          pCVar3 = std::optional<slang::ConstantRange>::operator*
                             ((optional<slang::ConstantRange> *)0xa1f209);
          local_1d0 = *pCVar3;
          local_220 = Type::getArrayElementType(in_stack_fffffffffffff938);
          Type::getBitstreamWidth(in_stack_fffffffffffff938);
          ConstantRange::width((ConstantRange *)0xa1f263);
          oVar5 = checkedMulU64(CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
                                (uint64_t)in_stack_fffffffffffff938);
          local_230._M_value =
               oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_payload;
          in_stack_fffffffffffff997 =
               oVar5.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_engaged;
          local_228 = in_stack_fffffffffffff997;
          bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_long> *)0xa1f2ae);
          if (bVar1) {
            in_stack_fffffffffffff996 =
                 std::operator<=><unsigned_long,_unsigned_long>
                           ((optional<unsigned_long> *)in_stack_fffffffffffff948,
                            (unsigned_long *)
                            CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940));
            local_231 = in_stack_fffffffffffff996._M_value;
            std::__cmp_cat::__unspec::__unspec(&local_232,(__unspec *)0x0);
            bVar1 = std::operator>(local_231);
            if (!bVar1) {
              if ((*(uint64_t *)&(in_R8->super_VariableSymbol).super_ValueSymbol.super_Symbol != 0)
                 && (bVar1 = std::optional::operator_cast_to_bool
                                       ((optional<unsigned_int> *)0xa1f381), !bVar1)) {
                in_stack_fffffffffffff995 =
                     std::operator<=><unsigned_long,_unsigned_long>
                               ((optional<unsigned_long> *)in_stack_fffffffffffff948,
                                (unsigned_long *)
                                CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940));
                local_249 = in_stack_fffffffffffff995._M_value;
                std::__cmp_cat::__unspec::__unspec(&local_24a,(__unspec *)0x0);
                bVar1 = std::operator>=(local_249);
                if (bVar1) {
                  *(uint64_t *)&(in_R8->super_VariableSymbol).super_ValueSymbol.super_Symbol = 0;
                }
                else {
                  puVar4 = std::optional<unsigned_long>::operator*
                                     ((optional<unsigned_long> *)0xa1f3ed);
                  *(uint64_t *)&(in_R8->super_VariableSymbol).super_ValueSymbol.super_Symbol =
                       *(uint64_t *)&(in_R8->super_VariableSymbol).super_ValueSymbol.super_Symbol -
                       *puVar4;
                }
              }
              if (local_1d0.left == local_1d0.right) {
                unpackBitstream(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
                                in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,
                                in_stack_fffffffffffffc18);
                slang::ConstantValue::operator=
                          ((ConstantValue *)
                           CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                           (ConstantValue *)in_stack_fffffffffffff928);
                slang::ConstantValue::~ConstantValue((ConstantValue *)0xa1f46c);
              }
              else {
                in_stack_fffffffffffff980 = local_220;
                uVar2 = Type::getSelectableWidth(in_stack_fffffffffffff938);
                in_stack_fffffffffffff988 = (undefined4)uVar2;
                in_stack_fffffffffffff98c = (int32_t)(uVar2 >> 0x20);
                in_stack_fffffffffffff97c = ConstantRange::width((ConstantRange *)0xa1f4af);
                in_stack_fffffffffffff970 =
                     (vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                     (CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988) *
                     (ulong)in_stack_fffffffffffff97c);
                std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0xa1f4d6);
                FixedSizeUnpackedArrayType::FixedSizeUnpackedArrayType
                          ((FixedSizeUnpackedArrayType *)
                           sVar6._M_extent._M_extent_value._M_extent_value,in_stack_fffffffffffff950
                           ,(ConstantRange)sVar6._M_ptr,(uint64_t)in_stack_fffffffffffff948,
                           CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940));
                unpackBitstream(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
                                in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,
                                in_stack_fffffffffffffc18);
                slang::ConstantValue::operator=
                          ((ConstantValue *)
                           CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                           (ConstantValue *)in_stack_fffffffffffff928);
                slang::ConstantValue::~ConstantValue((ConstantValue *)0xa1f553);
              }
              goto LAB_00a1f5ae;
            }
          }
          local_238 = 0x180009;
          local_248 = (local_68->withExpr->sourceRange).startLoc;
          SStack_240 = (local_68->withExpr->sourceRange).endLoc;
          code.subsystem._1_1_ = in_stack_fffffffffffff995._M_value;
          code.subsystem._0_1_ = in_stack_fffffffffffff994;
          code.code._0_1_ = in_stack_fffffffffffff996._M_value;
          code.code._1_1_ = in_stack_fffffffffffff997;
          range_00.endLoc._0_4_ = in_stack_fffffffffffff988;
          range_00.startLoc = (SourceLocation)in_stack_fffffffffffff980;
          range_00.endLoc._4_4_ = in_stack_fffffffffffff98c;
          EvalContext::addDiag
                    ((EvalContext *)CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
                     code,range_00);
          local_1 = 0;
          local_f8 = 1;
        }
        else {
          local_1 = 0;
          local_f8 = 1;
        }
      }
      slang::ConstantValue::~ConstantValue((ConstantValue *)0xa1f9fe);
      in_stack_fffffffffffff930 = local_f8;
      if ((local_f8 != 0) && (local_f8 == 1)) goto LAB_00a1fa56;
    }
    __gnu_cxx::
    __normal_iterator<const_slang::ast::StreamingConcatenationExpression::StreamExpression_*,_std::span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>_>
    ::operator++(&local_58);
  } while( true );
}

Assistant:

static bool unpackConcatenation(const StreamingConcatenationExpression& lhs, PackIterator& iter,
                                const PackIterator iterEnd, uint64_t& bitOffset,
                                uint64_t& dynamicSize, EvalContext& context,
                                SmallVectorBase<ConstantValue>* dryRun = nullptr) {
    for (auto& stream : lhs.streams()) {
        auto& operand = *stream.operand;
        if (operand.kind == ExpressionKind::Streaming) {
            auto& concat = operand.as<StreamingConcatenationExpression>();
            if (dryRun || !concat.getSliceSize()) {
                if (!unpackConcatenation(concat, iter, iterEnd, bitOffset, dynamicSize, context,
                                         dryRun)) {
                    return false;
                }
                continue;
            }

            // A dry run collects rvalue without storing lvalue
            uint64_t dynamicSizeSave = dynamicSize;
            SmallVector<ConstantValue> toBeOrdered;
            if (!unpackConcatenation(concat, iter, iterEnd, bitOffset, dynamicSize, context,
                                     &toBeOrdered)) {
                return false;
            }

            // Re-order to a new rvalue with the slice size
            ConstantValue cv = std::vector(toBeOrdered.begin(), toBeOrdered.end());
            uint64_t streamWidth = cv.getBitstreamWidth();
            auto rvalue = Bitstream::reOrder(std::move(cv), concat.getSliceSize(), streamWidth);

            SmallVector<ConstantValue*> packed;
            packBitstream(rvalue, packed);

            // A real pass stores lvalue from new rvalue
            auto iterConcat = std::cbegin(packed);
            uint64_t bit = 0;
            if (!unpackConcatenation(concat, iterConcat, std::cend(packed), bit, dynamicSizeSave,
                                     context)) {
                return false;
            }

            SLANG_ASSERT(dynamicSizeSave == dynamicSize);
            SLANG_ASSERT(iterConcat == std::cend(packed) && !bit);
        }
        else {
            auto& arrayType = *operand.type;
            ConstantRange with;
            ConstantValue rvalue;
            if (stream.withExpr) {
                auto range = stream.withExpr->evalSelector(context, /* enforceBounds */ false);
                if (!range)
                    return false;

                with = *range;

                auto elemType = arrayType.getArrayElementType();
                SLANG_ASSERT(elemType);

                auto withSize = checkedMulU64(elemType->getBitstreamWidth(), with.width());
                if (!withSize || withSize > Type::MaxBitWidth) {
                    context.addDiag(diag::ObjectTooLarge, stream.withExpr->sourceRange);
                    return false;
                }

                if (dynamicSize > 0 && !stream.constantWithWidth) {
                    if (withSize >= dynamicSize)
                        dynamicSize = 0;
                    else
                        dynamicSize -= *withSize;
                }

                if (with.left == with.right) {
                    rvalue = unpackBitstream(*elemType, iter, iterEnd, bitOffset, dynamicSize);
                }
                else {
                    // We already checked for overflow earlier so it's fine to create this
                    // temporary array result type as-is.
                    FixedSizeUnpackedArrayType rvalueType(
                        *elemType, with, elemType->getSelectableWidth() * with.width(), *withSize);

                    rvalue = unpackBitstream(rvalueType, iter, iterEnd, bitOffset, dynamicSize);
                }
            }
            else {
                rvalue = unpackBitstream(arrayType, iter, iterEnd, bitOffset, dynamicSize);
            }

            if (dryRun) {
                dryRun->emplace_back(std::move(rvalue));
                continue;
            }

            LValue lvalue = operand.evalLValue(context);
            if (!lvalue)
                return false;

            if (stream.withExpr) {
                if (with.left != with.right && arrayType.isQueue() && !rvalue.isQueue())
                    rvalue = constContainer(arrayType, rvalue.elements());

                auto elemType = arrayType.getArrayElementType();
                if (!arrayType.hasFixedRange()) {
                    // When the array is a variable-size array, it shall be resized to
                    // accommodate the range expression.
                    SLANG_ASSERT(with.left <= with.right);
                    auto oldValue = lvalue.load();
                    if (oldValue.size() <= static_cast<uint32_t>(with.right)) {
                        auto newValue = Bitstream::resizeToRange(std::move(oldValue),
                                                                 {0, with.right},
                                                                 elemType->getDefaultValue(), true);
                        lvalue.store(newValue);
                    }
                }

                if (with.left == with.right)
                    lvalue.addIndex(with.left, elemType->getDefaultValue());
                else
                    lvalue.addArraySlice(with, elemType->getDefaultValue());
            }

            lvalue.store(rvalue);
        }
    }

    return true;
}